

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType
          (UniformType *this,GLenum _enumType,
          vector<int,_std::allocator<int>_> *_arraySizesSegmented)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_38;
  size_t i;
  vector<int,_std::allocator<int>_> *_arraySizesSegmented_local;
  GLenum _enumType_local;
  UniformType *this_local;
  
  this->enumType = _enumType;
  std::vector<int,_std::allocator<int>_>::vector(&this->arraySizesSegmented,_arraySizesSegmented);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes);
  std::__cxx11::string::string((string *)&this->strType);
  std::__cxx11::string::string((string *)&this->refStrType);
  std::pair<int,_int>::pair<int,_int,_true>(&this->size);
  this->isArray = true;
  this->signedType = true;
  this->arraySize = 1;
  local_38 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->arraySizesSegmented);
    if (sVar1 <= local_38) {
      fill(this);
      return;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->arraySizesSegmented,local_38)
    ;
    if (*pvVar2 < 1) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->arraySizesSegmented,local_38)
    ;
    this->arraySize = *pvVar2 * this->arraySize;
    local_38 = local_38 + 1;
  }
  __assert_fail("arraySizesSegmented[i] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x11b,
                "glcts::(anonymous namespace)::UniformType::UniformType(GLenum, const std::vector<int> &)"
               );
}

Assistant:

UniformType(GLenum _enumType, const std::vector<int>& _arraySizesSegmented)
		: enumType(_enumType), arraySizesSegmented(_arraySizesSegmented), isArray(true), signedType(true)
	{
		arraySize = 1;
		for (size_t i = 0; i < arraySizesSegmented.size(); i++)
		{
			assert(arraySizesSegmented[i] > 0);
			arraySize *= arraySizesSegmented[i];
		}
		fill();
	}